

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ExprFunction(sqlite3_context *pCtx,int nArg,sqlite3_value **apVal,int bTcl)

{
  uchar *puVar1;
  char *pcVar2;
  char *local_88;
  char *zText;
  Fts5Config *pFStack_78;
  int iArg;
  Fts5Config *pConfig;
  char *pcStack_68;
  int nConfig;
  char *zNearsetCmd;
  char **azConfig;
  int i;
  int rc;
  Fts5Expr *pExpr;
  char *zErr;
  char *zExpr;
  sqlite3 *db;
  Fts5Global *pGlobal;
  sqlite3_value **ppsStack_20;
  int bTcl_local;
  sqlite3_value **apVal_local;
  sqlite3_context *psStack_10;
  int nArg_local;
  sqlite3_context *pCtx_local;
  
  pGlobal._4_4_ = bTcl;
  ppsStack_20 = apVal;
  apVal_local._4_4_ = nArg;
  psStack_10 = pCtx;
  db = (sqlite3 *)sqlite3_user_data(pCtx);
  zExpr = (char *)sqlite3_context_db_handle(psStack_10);
  zErr = (char *)0x0;
  pExpr = (Fts5Expr *)0x0;
  _i = (Fts5Expr *)0x0;
  pcStack_68 = "nearset";
  pFStack_78 = (Fts5Config *)0x0;
  zText._4_4_ = 1;
  if (apVal_local._4_4_ < 1) {
    pcVar2 = "fts5_expr";
    if (pGlobal._4_4_ != 0) {
      pcVar2 = "fts5_expr_tcl";
    }
    pExpr = (Fts5Expr *)sqlite3_mprintf("wrong number of arguments to function %s",pcVar2);
    sqlite3_result_error(psStack_10,(char *)pExpr,-1);
    sqlite3_free(pExpr);
  }
  else {
    if ((pGlobal._4_4_ != 0) && (1 < apVal_local._4_4_)) {
      pcStack_68 = (char *)sqlite3_value_text(ppsStack_20[1]);
      zText._4_4_ = 2;
    }
    pConfig._4_4_ = (apVal_local._4_4_ - zText._4_4_) + 3;
    zNearsetCmd = (char *)sqlite3_malloc64((long)pConfig._4_4_ << 3);
    if (zNearsetCmd == (char *)0x0) {
      sqlite3_result_error_nomem(psStack_10);
    }
    else {
      zNearsetCmd[0] = '\0';
      zNearsetCmd[1] = '\0';
      zNearsetCmd[2] = '\0';
      zNearsetCmd[3] = '\0';
      zNearsetCmd[4] = '\0';
      zNearsetCmd[5] = '\0';
      zNearsetCmd[6] = '\0';
      zNearsetCmd[7] = '\0';
      *(char **)(zNearsetCmd + 8) = "main";
      *(char **)(zNearsetCmd + 0x10) = "tbl";
      azConfig._0_4_ = 3;
      for (; zText._4_4_ < apVal_local._4_4_; zText._4_4_ = zText._4_4_ + 1) {
        puVar1 = sqlite3_value_text(ppsStack_20[zText._4_4_]);
        *(uchar **)(zNearsetCmd + (long)(int)azConfig * 8) = puVar1;
        azConfig._0_4_ = (int)azConfig + 1;
      }
      zErr = (char *)sqlite3_value_text(*ppsStack_20);
      azConfig._4_4_ =
           sqlite3Fts5ConfigParse
                     ((Fts5Global *)db,(sqlite3 *)zExpr,pConfig._4_4_,(char **)zNearsetCmd,
                      &stack0xffffffffffffff88,(char **)&pExpr);
      if (azConfig._4_4_ == 0) {
        azConfig._4_4_ =
             sqlite3Fts5ExprNew(pFStack_78,pFStack_78->nCol,zErr,(Fts5Expr **)&i,(char **)&pExpr);
      }
      if (azConfig._4_4_ == 0) {
        if (_i->pRoot->xNext == (_func_int_Fts5Expr_ptr_Fts5ExprNode_ptr_int_i64 *)0x0) {
          local_88 = sqlite3_mprintf("");
        }
        else if (pGlobal._4_4_ == 0) {
          local_88 = fts5ExprPrint(pFStack_78,_i->pRoot);
        }
        else {
          local_88 = fts5ExprPrintTcl(pFStack_78,pcStack_68,_i->pRoot);
        }
        if (local_88 == (char *)0x0) {
          azConfig._4_4_ = 7;
        }
        else {
          sqlite3_result_text(psStack_10,local_88,-1,(_func_void_void_ptr *)0xffffffffffffffff);
          sqlite3_free(local_88);
        }
      }
      if (azConfig._4_4_ != 0) {
        if (pExpr == (Fts5Expr *)0x0) {
          sqlite3_result_error_code(psStack_10,azConfig._4_4_);
        }
        else {
          sqlite3_result_error(psStack_10,(char *)pExpr,-1);
          sqlite3_free(pExpr);
        }
      }
      sqlite3_free(zNearsetCmd);
      sqlite3Fts5ConfigFree(pFStack_78);
      sqlite3Fts5ExprFree(_i);
    }
  }
  return;
}

Assistant:

static void fts5ExprFunction(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args */
  sqlite3_value **apVal,          /* Function arguments */
  int bTcl
){
  Fts5Global *pGlobal = (Fts5Global*)sqlite3_user_data(pCtx);
  sqlite3 *db = sqlite3_context_db_handle(pCtx);
  const char *zExpr = 0;
  char *zErr = 0;
  Fts5Expr *pExpr = 0;
  int rc;
  int i;

  const char **azConfig;          /* Array of arguments for Fts5Config */
  const char *zNearsetCmd = "nearset";
  int nConfig;                    /* Size of azConfig[] */
  Fts5Config *pConfig = 0;
  int iArg = 1;

  if( nArg<1 ){
    zErr = sqlite3_mprintf("wrong number of arguments to function %s",
        bTcl ? "fts5_expr_tcl" : "fts5_expr"
    );
    sqlite3_result_error(pCtx, zErr, -1);
    sqlite3_free(zErr);
    return;
  }

  if( bTcl && nArg>1 ){
    zNearsetCmd = (const char*)sqlite3_value_text(apVal[1]);
    iArg = 2;
  }

  nConfig = 3 + (nArg-iArg);
  azConfig = (const char**)sqlite3_malloc64(sizeof(char*) * nConfig);
  if( azConfig==0 ){
    sqlite3_result_error_nomem(pCtx);
    return;
  }
  azConfig[0] = 0;
  azConfig[1] = "main";
  azConfig[2] = "tbl";
  for(i=3; iArg<nArg; iArg++){
    azConfig[i++] = (const char*)sqlite3_value_text(apVal[iArg]);
  }

  zExpr = (const char*)sqlite3_value_text(apVal[0]);

  rc = sqlite3Fts5ConfigParse(pGlobal, db, nConfig, azConfig, &pConfig, &zErr);
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5ExprNew(pConfig, pConfig->nCol, zExpr, &pExpr, &zErr);
  }
  if( rc==SQLITE_OK ){
    char *zText;
    if( pExpr->pRoot->xNext==0 ){
      zText = sqlite3_mprintf("");
    }else if( bTcl ){
      zText = fts5ExprPrintTcl(pConfig, zNearsetCmd, pExpr->pRoot);
    }else{
      zText = fts5ExprPrint(pConfig, pExpr->pRoot);
    }
    if( zText==0 ){
      rc = SQLITE_NOMEM;
    }else{
      sqlite3_result_text(pCtx, zText, -1, SQLITE_TRANSIENT);
      sqlite3_free(zText);
    }
  }

  if( rc!=SQLITE_OK ){
    if( zErr ){
      sqlite3_result_error(pCtx, zErr, -1);
      sqlite3_free(zErr);
    }else{
      sqlite3_result_error_code(pCtx, rc);
    }
  }
  sqlite3_free((void *)azConfig);
  sqlite3Fts5ConfigFree(pConfig);
  sqlite3Fts5ExprFree(pExpr);
}